

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,uint64_t match_flags)

{
  char *__s;
  char *__s_00;
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_type sVar6;
  void *pvVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *__data;
  long lVar12;
  ulong __pos;
  string *psVar13;
  precise_unit pVar14;
  string cString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  uint32_t in_stack_ffffffffffffff3c;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string *local_80;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ulong uVar9;
  
  pVar14._8_8_ = un;
  pVar14.multiplier_ = *(double *)this;
  local_80 = __return_storage_ptr__;
  to_string_internal_abi_cxx11_(&local_c0,*(units **)(this + 8),pVar14,match_flags);
  local_74 = *(int *)(this + 0xc);
  lVar12 = 0;
  do {
    __s = *(char **)(&DAT_005616b8 + lVar12);
    sVar5 = strlen(__s);
    sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,__s,
                 0,sVar5);
    if (sVar6 != 0xffffffffffffffff) {
      iVar4 = *(int *)(&DAT_005616ac + lVar12);
      __s_00 = *(char **)((long)&PTR_anon_var_dwarf_2129d0c_005616b0 + lVar12);
      do {
        sVar5 = strlen(__s_00);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,sVar6
                ,(long)iVar4,__s_00,sVar5);
        iVar3 = *(int *)((long)&clean_unit_string(std::__cxx11::string,unsigned_int)::powerseq +
                        lVar12);
        sVar5 = strlen(__s);
        sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c0,__s,sVar6 + (long)iVar3,sVar5);
      } while (sVar6 != 0xffffffffffffffff);
    }
    iVar4 = local_74;
    _Var2._M_p = local_c0._M_dataplus._M_p;
    lVar12 = lVar12 + 0x18;
  } while (lVar12 != 0x108);
  if (local_c0._M_string_length != 0) {
    if (((*local_c0._M_dataplus._M_p == '(') &&
        (local_c0._M_dataplus._M_p[local_c0._M_string_length - 1] == ')')) &&
       ((local_c0._M_string_length == 1 ||
        (pvVar7 = memchr(local_c0._M_dataplus._M_p + 1,0x28,local_c0._M_string_length - 1),
        pvVar7 == (void *)0x0 || (long)pvVar7 - (long)_Var2._M_p == -1)))) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0);
      if (local_c0._M_string_length != 1) {
        if (local_c0._M_string_length - 1 == 1) {
          *local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p[1];
        }
        else {
          memmove(local_c0._M_dataplus._M_p,local_c0._M_dataplus._M_p + 1,
                  local_c0._M_string_length - 1);
        }
      }
      local_c0._M_dataplus._M_p[local_c0._M_string_length - 1] = '\0';
      local_c0._M_string_length = local_c0._M_string_length - 1;
    }
    sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 "00000",0,5);
    if (sVar6 != 0xffffffffffffffff) {
      reduce_number_length(&local_c0,'0');
    }
    sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 "99999",0,5);
    if (sVar6 != 0xffffffffffffffff) {
      reduce_number_length(&local_c0,'9');
    }
  }
  if (iVar4 != 0) {
    getCommodityName_abi_cxx11_(in_stack_ffffffffffffff3c);
    iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&local_a0,0,7,"CXCOMM[");
    if ((iVar3 != 0) && (local_a0._M_string_length != 0)) {
      sVar6 = 0;
      _Var1._M_p = local_a0._M_dataplus._M_p;
      uVar9 = local_a0._M_string_length;
      do {
        while (pvVar7 = memchr("{}[]()",(int)_Var1._M_p[sVar6],6), pvVar7 == (void *)0x0) {
          sVar6 = sVar6 + 1;
          if (uVar9 <= sVar6) goto LAB_003edb17;
        }
        if ((sVar6 == 0) || (_Var1._M_p[sVar6 - 1] != '\\')) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert(&local_a0,sVar6,1,'\\');
          sVar6 = sVar6 + 1;
          uVar9 = local_a0._M_string_length;
        }
        sVar6 = sVar6 + 1;
        _Var1._M_p = local_a0._M_dataplus._M_p;
      } while (sVar6 < uVar9);
    }
LAB_003edb17:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_replace_aux(&local_a0,0,0,1,'{');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_a0,'}');
    psVar13 = local_80;
    uVar9 = local_c0._M_string_length;
    if (iVar4 < 0) {
      if (local_c0._M_string_length == 0) {
LAB_003edcc3:
        pVar14 = checkForCustomUnit((string *)&local_a0);
        if (pVar14.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar14.multiplier_)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert(&local_a0,0,1,'1');
        }
        if (local_c0._M_string_length == 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                    '1');
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,'/'
                 );
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                  local_a0._M_dataplus._M_p,local_a0._M_string_length);
      }
      else {
        do {
          uVar8 = uVar9 - 1;
          if (uVar9 == 0) goto LAB_003edcc3;
          lVar12 = uVar9 - 1;
          uVar9 = uVar8;
          __pos = local_c0._M_string_length;
        } while (local_c0._M_dataplus._M_p[lVar12] != '/');
        do {
          __pos = __pos - 1;
          if ((local_c0._M_dataplus._M_p[__pos] == '*') || (local_c0._M_dataplus._M_p[__pos] == '^')
             ) {
            if (uVar8 <= __pos) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0
                      ,__pos,0,local_a0._M_dataplus._M_p,local_a0._M_string_length);
              goto LAB_003eddc5;
            }
            break;
          }
        } while (__pos != 0);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                  local_a0._M_dataplus._M_p,local_a0._M_string_length);
      }
    }
    else {
      for (; uVar9 != 0; uVar9 = uVar9 - 1) {
        if ((local_c0._M_dataplus._M_p[uVar9 - 1] == '/') ||
           (local_c0._M_dataplus._M_p[uVar9 - 1] == '^')) {
          iVar4 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_c0,0,2,"1/");
          if (iVar4 != 0) {
            if (local_c0._M_string_length == 0) goto LAB_003edc90;
            sVar6 = 0;
            goto LAB_003edc76;
          }
          pVar14 = checkForCustomUnit((string *)&local_a0);
          if (pVar14.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar14.multiplier_)) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert(&local_a0,0,1,'1');
          }
          _Var1._M_p = local_a0._M_dataplus._M_p;
          sVar5 = strlen(local_a0._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,0,1
                  ,_Var1._M_p,sVar5);
          goto LAB_003eddc5;
        }
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                local_a0._M_dataplus._M_p,local_a0._M_string_length);
    }
    goto LAB_003eddc5;
  }
  psVar13 = local_80;
  if ((local_c0._M_string_length != 0) && (9 < (byte)(*local_c0._M_dataplus._M_p - 0x30U))) {
    (local_80->_M_dataplus)._M_p = (pointer)&local_80->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
      (local_80->field_2)._M_allocated_capacity =
           CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,local_c0.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&local_80->field_2 + 8) = local_c0.field_2._8_8_;
    }
    else {
      (local_80->_M_dataplus)._M_p = local_c0._M_dataplus._M_p;
      (local_80->field_2)._M_allocated_capacity =
           CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,local_c0.field_2._M_local_buf[0]);
    }
    goto LAB_003ede15;
  }
  goto LAB_003edde5;
  while (sVar6 = sVar6 + 1, local_c0._M_string_length != sVar6) {
LAB_003edc76:
    if (((byte)local_c0._M_dataplus._M_p[sVar6] - 0x2a < 0x35) &&
       ((0x10000000000021U >> ((ulong)((byte)local_c0._M_dataplus._M_p[sVar6] - 0x2a) & 0x3f) & 1)
        != 0)) goto LAB_003edc97;
  }
LAB_003edc90:
  sVar6 = 0xffffffffffffffff;
LAB_003edc97:
  if ((local_c0._M_dataplus._M_p[sVar6] == '^') && (local_c0._M_dataplus._M_p[sVar6 + 1] == '-')) {
    pVar14 = checkForCustomUnit((string *)&local_a0);
    if (pVar14.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar14.multiplier_)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (&local_a0,0,1,'1');
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_a0._M_dataplus._M_p,
               local_a0._M_dataplus._M_p + local_a0._M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_70,"*");
    pbVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_70,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    local_50._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
    paVar11 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar11) {
      local_50.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_50._M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
               &local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,sVar6,
               0,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  }
LAB_003eddc5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
LAB_003edde5:
  (psVar13->_M_dataplus)._M_p = (pointer)&psVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
    (psVar13->field_2)._M_allocated_capacity =
         CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,local_c0.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&psVar13->field_2 + 8) = local_c0.field_2._8_8_;
  }
  else {
    (psVar13->_M_dataplus)._M_p = local_c0._M_dataplus._M_p;
    (psVar13->field_2)._M_allocated_capacity =
         CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,local_c0.field_2._M_local_buf[0]);
  }
LAB_003ede15:
  psVar13->_M_string_length = local_c0._M_string_length;
  return psVar13;
}

Assistant:

std::string to_string(const precise_unit& un, std::uint64_t match_flags)
{
    return clean_unit_string(
        to_string_internal(un, match_flags), un.commodity());
}